

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configset.hh
# Opt level: O1

list<bool,_std::allocator<bool>_> * __thiscall
utilmm::config_set::get<std::__cxx11::list<bool,std::allocator<bool>>>
          (list<bool,_std::allocator<bool>_> *__return_storage_ptr__,config_set *this,string *name,
          list<bool,_std::allocator<bool>_> *defval,type *enabler)

{
  size_t *psVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  const_iterator it;
  _List_node_base *p_Var4;
  stringlist values;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  utilmm::config_set::
  get<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)&local_60,(list_conflict *)this,(type *)name);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  if (local_60._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_60) {
    std::__cxx11::list<bool,_std::allocator<bool>_>::list(__return_storage_ptr__,defval);
  }
  else {
    (__return_storage_ptr__->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node._M_size
         = 0;
    p_Var4 = local_60._M_impl._M_node.super__List_node_base._M_next;
    do {
      bVar2 = utilmm::config_set::convert<bool>((string *)(p_Var4 + 1));
      p_Var3 = (_List_node_base *)operator_new(0x18);
      *(bool *)&p_Var3[1]._M_next = bVar2;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(__return_storage_ptr__->super__List_base<bool,_std::allocator<bool>_>)._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&local_60);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_60);
  return __return_storage_ptr__;
}

Assistant:

T config_set::get(std::string const& name, T const& defval,
            typename boost::enable_if< details::is_list<T> >::type *enabler) const
    {
        stringlist values = get< stringlist >(name);
        if (values.empty())
            return defval;

        T result;
        for (stringlist::const_iterator it = values.begin(); it != values.end(); ++it)
            result.push_back(convert<typename T::value_type>(*it));

        return result;
    }